

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void iCopyColors<cI16,cBGRA,bCopyAlpha>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  BYTE BVar2;
  undefined2 uVar3;
  int iVar4;
  int iVar5;
  FSpecialColormap *pFVar6;
  EBlend EVar7;
  long lVar8;
  byte *pbVar9;
  BYTE *pBVar10;
  long lVar11;
  int iVar12;
  
  pFVar6 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
    EVar7 = BLEND_NONE;
  }
  else {
    EVar7 = inf->blend;
  }
  switch(EVar7) {
  case BLEND_NONE:
    if (0 < count) {
      pBVar10 = pin + 1;
      lVar8 = 0;
      do {
        pout[lVar8 * 4 + 2] = *pBVar10;
        pout[lVar8 * 4 + 1] = *pBVar10;
        pout[lVar8 * 4] = *pBVar10;
        pout[lVar8 * 4 + 3] = 0xff;
        lVar8 = lVar8 + 1;
        pBVar10 = pBVar10 + step;
      } while (count != (int)lVar8);
    }
    break;
  case BLEND_ICEMAP:
    if (0 < count) {
      pbVar9 = pin + 1;
      lVar8 = 0;
      do {
        bVar1 = *pbVar9 >> 4;
        BVar2 = IcePalette[bVar1][1];
        pout[lVar8 * 4 + 2] = IcePalette[bVar1][0];
        pout[lVar8 * 4 + 1] = BVar2;
        pout[lVar8 * 4] = IcePalette[bVar1][2];
        pout[lVar8 * 4 + 3] = 0xff;
        lVar8 = lVar8 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar8);
    }
    break;
  case BLEND_OVERLAY:
    if (0 < count) {
      pbVar9 = pin + 1;
      lVar8 = 0;
      do {
        iVar12 = (uint)*pbVar9 * inf->blendcolor[3];
        iVar4 = inf->blendcolor[1];
        iVar5 = inf->blendcolor[2];
        pout[lVar8 * 4 + 2] = (BYTE)((uint)(inf->blendcolor[0] + iVar12) >> 0x10);
        pout[lVar8 * 4 + 1] = (BYTE)((uint)(iVar4 + iVar12) >> 0x10);
        pout[lVar8 * 4] = (BYTE)((uint)(iVar12 + iVar5) >> 0x10);
        pout[lVar8 * 4 + 3] = 0xff;
        lVar8 = lVar8 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar8);
    }
    break;
  case BLEND_MODULATE:
    if (0 < count) {
      pbVar9 = pin + 1;
      lVar8 = 0;
      do {
        bVar1 = *pbVar9;
        iVar4 = inf->blendcolor[1];
        iVar5 = inf->blendcolor[2];
        pout[lVar8 * 4 + 2] = (BYTE)(inf->blendcolor[0] * (uint)bVar1 >> 0x10);
        pout[lVar8 * 4 + 1] = (BYTE)(iVar4 * (uint)bVar1 >> 0x10);
        pout[lVar8 * 4] = (BYTE)((uint)bVar1 * iVar5 >> 0x10);
        pout[lVar8 * 4 + 3] = 0xff;
        lVar8 = lVar8 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar8);
    }
    break;
  default:
    lVar8 = (long)inf->blend;
    if (lVar8 < 0x21) {
      if (0 < count && BLEND_ICEMAP < inf->blend) {
        pBVar10 = pin + 1;
        lVar8 = 0;
        do {
          BVar2 = *pBVar10;
          pout[lVar8 * 4 + 2] = BVar2;
          pout[lVar8 * 4 + 1] = BVar2;
          pout[lVar8 * 4] = BVar2;
          pout[lVar8 * 4 + 3] = 0xff;
          lVar8 = lVar8 + 1;
          pBVar10 = pBVar10 + step;
        } while (count != (int)lVar8);
      }
    }
    else if (0 < count) {
      pbVar9 = pin + 1;
      lVar11 = 0;
      do {
        uVar3 = *(undefined2 *)((long)pFVar6 + (ulong)*pbVar9 * 4 + lVar8 * 0x518 + -0xa700);
        pout[lVar11 * 4 + 2] =
             *(BYTE *)((long)pFVar6 + (ulong)*pbVar9 * 4 + lVar8 * 0x518 + -0xa6fe);
        *(undefined2 *)(pout + lVar11 * 4) = uVar3;
        pout[lVar11 * 4 + 3] = 0xff;
        lVar11 = lVar11 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar11);
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}